

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyOper.c
# Opt level: O2

Ivy_Obj_t * Ivy_Oper(Ivy_Man_t *p,Ivy_Obj_t *p0,Ivy_Obj_t *p1,Ivy_Type_t Type)

{
  Ivy_Obj_t *pIVar1;
  Ivy_Obj_t *p1_00;
  
  if (Type == IVY_EXOR) {
    pIVar1 = Ivy_And(p,p0,(Ivy_Obj_t *)((ulong)p1 ^ 1));
    p1_00 = Ivy_And(p,(Ivy_Obj_t *)((ulong)p0 ^ 1),p1);
    pIVar1 = Ivy_Or(p,pIVar1,p1_00);
    return pIVar1;
  }
  if (Type == IVY_AND) {
    pIVar1 = Ivy_And(p,p0,p1);
    return pIVar1;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyOper.c"
                ,0x45,"Ivy_Obj_t *Ivy_Oper(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t)");
}

Assistant:

Ivy_Obj_t * Ivy_Oper( Ivy_Man_t * p, Ivy_Obj_t * p0, Ivy_Obj_t * p1, Ivy_Type_t Type )
{
    if ( Type == IVY_AND )
        return Ivy_And( p, p0, p1 );
    if ( Type == IVY_EXOR )
        return Ivy_Exor( p, p0, p1 );
    assert( 0 );
    return NULL;
}